

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_IN(void)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  Z80Reg local_18;
  int iStack_14;
  Z80Reg reg;
  int e [3];
  
  do {
    _iStack_14 = 0xffffffffffffffff;
    e[0] = -1;
    local_18 = GetRegister(&::lp);
    if ((local_18 == Z80_UNK) || (bVar1 = comma(&::lp), bVar1)) {
      if (local_18 == Z80_UNK) {
        local_18 = Z80_F;
      }
      if (((Options::IsI8080 & 1) == 0) && (bVar1 = NeedIoC(), bVar1)) {
        if (((uint)local_18 < 6) || (local_18 == Z80_A)) {
          _iStack_14 = CONCAT44(local_18 * 8 + 0x40,0xed);
        }
        else if (local_18 == Z80_F) {
          _iStack_14 = 0x70000000ed;
        }
        else {
          _iStack_14 = CONCAT44(reg,0xffffffff);
        }
      }
      else {
        bVar2 = GetByte(&::lp,false);
        _iStack_14 = (ulong)CONCAT14(bVar2,iStack_14);
        if (local_18 == Z80_A) {
          reg = (Z80Reg)bVar2;
          _iStack_14 = CONCAT44(reg,0xdb);
        }
      }
    }
    EmitBytes(&stack0xffffffffffffffec,true);
    uVar3 = (*DAT_001e16b0)(&::lp);
  } while ((uVar3 & 1) != 0);
  return;
}

Assistant:

static void OpCode_IN() {
		do {
			int e[] { -1, -1, -1 };
			Z80Reg reg = GetRegister(lp);
			if (Z80_UNK == reg || comma(lp)) {
				if (Z80_UNK == reg) reg = Z80_F;	// if there was no register, it may be "IN (C)"
				if ((!Options::IsI8080) && NeedIoC()) {
					e[0] = 0xed;
					switch (reg) {
						case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L: case Z80_A:
							e[1] = 0x40 + reg*8;	// regular IN reg,(C)
							break;
						case Z80_F:
							e[1] = 0x70;			// unofficial IN F,(C)
							break;
						default:
							e[0] = -1;				// invalid combination
							break;
					}
				} else {
					e[1] = GetByte(lp);
					if (Z80_A == reg) e[0] = 0xdb;	// IN A,(n)
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}